

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmTrapcc<(moira::Instr)163,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  
  SVar1 = str->style->syntax;
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  cVar7 = 't';
  lVar6 = 1;
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar7;
      cVar7 = "ftrapgt"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)((uVar3 & 0xffff) << 0x10 | uVar4 & 0xffff));
  }
  else {
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar7;
      cVar7 = "ftrapgt"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(UInt)((uVar3 & 0xffff) << 0x10 | uVar4 & 0xffff));
  }
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar7 = ';';
    lVar6 = 1;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar7;
      cVar7 = "trap%-2s  ; (2+)"[lVar6 + 10];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (S) {

                case Byte:

                    str << Ins<I>{};
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(ext);
                    break;
            }
            break;

        default:

            switch (S) {

                case Byte:

                    str << Ins<I>{} << str.tab;
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << str.tab << Imu(ext);
                    break;
            }
    }

    str << Av<I, M, S>{};
}